

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Client::~Client(Client *this)

{
  bool bVar1;
  pointer this_00;
  exception *ex;
  Client *this_local;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_001e1820;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->worker_);
  if (bVar1) {
    this_00 = std::unique_ptr<restincurl::Worker,_std::default_delete<restincurl::Worker>_>::
              operator->(&this->worker_);
    Worker::Close(this_00);
  }
  std::unique_ptr<restincurl::Worker,_std::default_delete<restincurl::Worker>_>::~unique_ptr
            (&this->worker_);
  return;
}

Assistant:

virtual ~Client() {
#if RESTINCURL_ENABLE_ASYNC
            if (worker_) {
                try {
                    worker_->Close();
                } catch (const std::exception& ex) {
                    RESTINCURL_LOG("~Client(): " << ex.what());
                }
            }
#endif
        }